

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

void __thiscall QDialog::done(QDialog *this,int r)

{
  QDialogPrivate *this_00;
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  int local_3c;
  void *local_38;
  int *piStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  this_00 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  QDialogPrivate::close(this_00,r);
  if (piVar2 == (int *)0x0) goto LAB_004e123e;
  if (piVar2[1] != 0) {
    iVar1 = (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xb0))(this_00);
    if (iVar1 == 1) {
LAB_004e11db:
      QMetaObject::activate((QObject *)this,&staticMetaObject,iVar1,(void **)0x0);
    }
    else if (iVar1 == 0) {
      iVar1 = 2;
      goto LAB_004e11db;
    }
    if (piVar2 == (int *)0x0) goto LAB_004e123e;
    if (piVar2[1] != 0) {
      piStack_30 = &local_3c;
      local_38 = (void *)0x0;
      local_3c = r;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
    }
  }
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
LAB_004e123e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::done(int r)
{
    QPointer<QDialog> guard(this);

    Q_D(QDialog);
    d->close(r);

    if (!guard)
        return;

    int dialogCode = d->dialogCode();
    if (dialogCode == QDialog::Accepted)
        emit accepted();
    else if (dialogCode == QDialog::Rejected)
        emit rejected();

    if (guard)
        emit finished(r);
}